

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MorphableModel.hpp
# Opt level: O0

Mesh * eos::morphablemodel::sample_to_mesh
                 (Mesh *__return_storage_ptr__,VectorXf *shape_instance,VectorXf *color_instance,
                 vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *tvi,
                 vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *tci,
                 vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                 *texture_coordinates,
                 vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                 *texture_triangle_indices)

{
  Index IVar1;
  Index IVar2;
  Index IVar3;
  size_type sVar4;
  CoeffReturnType pfVar5;
  CoeffReturnType y;
  CoeffReturnType z;
  reference pvVar6;
  float *x;
  float *y_00;
  float *z_00;
  ulong uVar7;
  const_reference pvVar8;
  const_reference x_00;
  const_reference y_01;
  reference this;
  bool bVar9;
  byte local_b9;
  Matrix<float,_2,_1,_0,_2,_1> local_98;
  int local_90;
  float local_8c;
  int i_2;
  float local_84;
  float local_80;
  float local_7c;
  float local_78;
  Matrix<float,_3,_1,_0,_3,_1> local_74;
  int local_68;
  int i_1;
  int local_58;
  int i;
  undefined1 local_41;
  size_type local_40;
  Index num_vertices;
  vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
  *texture_coordinates_local;
  vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *tci_local;
  vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *tvi_local;
  VectorXf *color_instance_local;
  VectorXf *shape_instance_local;
  Mesh *mesh;
  
  num_vertices = (Index)texture_coordinates;
  texture_coordinates_local =
       (vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *)tci;
  tci_local = tvi;
  tvi_local = (vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *)color_instance
  ;
  color_instance_local = shape_instance;
  shape_instance_local = (VectorXf *)__return_storage_ptr__;
  IVar1 = Eigen::PlainObjectBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>::rows
                    (&shape_instance->super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>)
  ;
  IVar2 = Eigen::PlainObjectBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>::rows
                    ((PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *)tvi_local);
  bVar9 = true;
  if (IVar1 != IVar2) {
    IVar3 = Eigen::EigenBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>::size
                      ((EigenBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *)tvi_local);
    bVar9 = IVar3 == 0;
  }
  if (!bVar9) {
    __assert_fail("shape_instance.rows() == color_instance.rows() || color_instance.size() == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/include/eos/morphablemodel/MorphableModel.hpp"
                  ,0x25c,
                  "core::Mesh eos::morphablemodel::sample_to_mesh(const Eigen::VectorXf &, const Eigen::VectorXf &, const std::vector<std::array<int, 3>> &, const std::vector<std::array<int, 3>> &, const std::vector<std::array<double, 2>> &, const std::vector<std::array<int, 3>> &)"
                 );
  }
  sVar4 = std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::size
                    ((vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *)
                     num_vertices);
  local_b9 = 1;
  if (sVar4 != 0) {
    sVar4 = std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::size
                      ((vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *
                       )num_vertices);
    IVar1 = Eigen::PlainObjectBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>::rows
                      (&color_instance_local->
                        super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>);
    local_b9 = 1;
    if (sVar4 != IVar1 / 3) {
      bVar9 = std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::empty
                        (texture_triangle_indices);
      local_b9 = bVar9 ^ 0xff;
    }
  }
  if ((local_b9 & 1) == 0) {
    __assert_fail("texture_coordinates.size() == 0 || texture_coordinates.size() == (shape_instance.rows() / 3) || !texture_triangle_indices .empty()"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/include/eos/morphablemodel/MorphableModel.hpp"
                  ,0x261,
                  "core::Mesh eos::morphablemodel::sample_to_mesh(const Eigen::VectorXf &, const Eigen::VectorXf &, const std::vector<std::array<int, 3>> &, const std::vector<std::array<int, 3>> &, const std::vector<std::array<double, 2>> &, const std::vector<std::array<int, 3>> &)"
                 );
  }
  IVar1 = Eigen::PlainObjectBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>::rows
                    (&color_instance_local->
                      super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>);
  local_40 = IVar1 / 3;
  local_41 = 0;
  core::Mesh::Mesh(__return_storage_ptr__);
  std::
  vector<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
  ::resize(&__return_storage_ptr__->vertices,local_40);
  for (local_58 = 0; (long)local_58 < (long)local_40; local_58 = local_58 + 1) {
    pfVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0> *)
                        color_instance_local,(long)(local_58 * 3));
    y = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_0>::operator()
                  ((DenseCoeffsBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0> *)color_instance_local
                   ,(long)(local_58 * 3 + 1));
    z = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_0>::operator()
                  ((DenseCoeffsBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0> *)color_instance_local
                   ,(long)(local_58 * 3 + 2));
    Eigen::Matrix<float,_3,_1,_0,_3,_1>::Matrix
              ((Matrix<float,_3,_1,_0,_3,_1> *)&stack0xffffffffffffff9c,pfVar5,y,z);
    pvVar6 = std::
             vector<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
             ::operator[](&__return_storage_ptr__->vertices,(long)local_58);
    Eigen::Matrix<float,_3,_1,_0,_3,_1>::operator=
              (pvVar6,(Matrix<float,_3,_1,_0,_3,_1> *)&stack0xffffffffffffff9c);
  }
  IVar3 = Eigen::EigenBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>::size
                    ((EigenBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *)tvi_local);
  if (0 < IVar3) {
    std::
    vector<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
    ::resize(&__return_storage_ptr__->colors,local_40);
    for (local_68 = 0; (long)local_68 < (long)local_40; local_68 = local_68 + 1) {
      pfVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_0>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0> *)tvi_local,
                          (long)(local_68 * 3));
      local_78 = 0.0;
      local_7c = 1.0;
      x = std::clamp<float>(pfVar5,&local_78,&local_7c);
      pfVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_0>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0> *)tvi_local,
                          (long)(local_68 * 3 + 1));
      local_80 = 0.0;
      local_84 = 1.0;
      y_00 = std::clamp<float>(pfVar5,&local_80,&local_84);
      pfVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_0>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0> *)tvi_local,
                          (long)(local_68 * 3 + 2));
      i_2 = 0;
      local_8c = 1.0;
      z_00 = std::clamp<float>(pfVar5,(float *)&i_2,&local_8c);
      Eigen::Matrix<float,_3,_1,_0,_3,_1>::Matrix(&local_74,x,y_00,z_00);
      pvVar6 = std::
               vector<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
               ::operator[](&__return_storage_ptr__->colors,(long)local_68);
      Eigen::Matrix<float,_3,_1,_0,_3,_1>::operator=(pvVar6,&local_74);
    }
  }
  std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::operator=
            (&__return_storage_ptr__->tvi,tci_local);
  std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::operator=
            (&__return_storage_ptr__->tci,
             (vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *)
             texture_coordinates_local);
  bVar9 = std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::empty
                    ((vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *)
                     num_vertices);
  if (!bVar9) {
    sVar4 = std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::size
                      ((vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *
                       )num_vertices);
    std::
    vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
    ::resize(&__return_storage_ptr__->texcoords,sVar4);
    for (local_90 = 0; uVar7 = (ulong)local_90,
        sVar4 = std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::
                size((vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *)
                     num_vertices), uVar7 < sVar4; local_90 = local_90 + 1) {
      pvVar8 = std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::
               operator[]((vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                           *)num_vertices,(long)local_90);
      x_00 = std::array<double,_2UL>::operator[](pvVar8,0);
      pvVar8 = std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::
               operator[]((vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                           *)num_vertices,(long)local_90);
      y_01 = std::array<double,_2UL>::operator[](pvVar8,1);
      Eigen::Matrix<float,2,1,0,2,1>::Matrix<double,double>
                ((Matrix<float,2,1,0,2,1> *)&local_98,x_00,y_01);
      this = std::
             vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
             ::operator[](&__return_storage_ptr__->texcoords,(long)local_90);
      Eigen::Matrix<float,_2,_1,_0,_2,_1>::operator=(this,&local_98);
    }
    bVar9 = std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::empty
                      (texture_triangle_indices);
    if (!bVar9) {
      std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::operator=
                (&__return_storage_ptr__->tti,texture_triangle_indices);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline core::Mesh sample_to_mesh(
    const Eigen::VectorXf& shape_instance, const Eigen::VectorXf& color_instance,
    const std::vector<std::array<int, 3>>& tvi, const std::vector<std::array<int, 3>>& tci,
    const std::vector<std::array<double, 2>>&
        texture_coordinates /* = std::vector<std::array<double, 2>>() */,
    const std::vector<std::array<int, 3>>& texture_triangle_indices /* = std::vector<std::array<int, 3>>() */)
{
    assert(shape_instance.rows() == color_instance.rows() ||
           color_instance.size() == 0); // The number of vertices (= model.getDataDimension() / 3) has to be
                                        // equal for both models, or, alternatively, it has to be a shape-only
                                        // model.
    assert(texture_coordinates.size() == 0 || texture_coordinates.size() == (shape_instance.rows() / 3) ||
           !texture_triangle_indices
                .empty()); // No texture coordinates are ok. If there are texture
                           // coordinates given, their number needs to be identical to the
                           // number of vertices, or texture_triangle_indices needs to be given.

    const auto num_vertices = shape_instance.rows() / 3;

    core::Mesh mesh;

    // Construct the mesh vertices:
    mesh.vertices.resize(num_vertices);
    for (auto i = 0; i < num_vertices; ++i)
    {
        mesh.vertices[i] = Eigen::Vector3f(
            shape_instance(i * 3 + 0), shape_instance(i * 3 + 1),
            shape_instance(i * 3 + 2)); // Note: This can probably be simplified now, Eigen on both sides!
    }

    // Assign the vertex colour information if it's not a shape-only model:
    if (color_instance.size() > 0)
    {
        mesh.colors.resize(num_vertices);
        for (auto i = 0; i < num_vertices; ++i)
        {
            mesh.colors[i] = Eigen::Vector3f(
                cpp17::clamp(color_instance(i * 3 + 0), 0.0f, 1.0f),
                cpp17::clamp(color_instance(i * 3 + 1), 0.0f, 1.0f),
                cpp17::clamp(color_instance(i * 3 + 2), 0.0f, 1.0f)); // We use RGB order everywhere.
        }
    }

    // Assign the triangle lists:
    mesh.tvi = tvi;
    mesh.tci = tci; // tci will be empty in case of a shape-only model

    // Texture coordinates, if the model has them:
    if (!texture_coordinates.empty())
    {
        mesh.texcoords.resize(texture_coordinates.size());
        for (auto i = 0; i < texture_coordinates.size(); ++i)
        {
            mesh.texcoords[i] = Eigen::Vector2f(texture_coordinates[i][0], texture_coordinates[i][1]);
        }
        if (!texture_triangle_indices.empty())
        {
            mesh.tti = texture_triangle_indices;
        }
    }

    return mesh;
}